

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::MemPass::RemoveUnreachableBlocks(MemPass *this,Function *func)

{
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar1;
  BasicBlock *pBVar2;
  pointer puVar3;
  size_type sVar4;
  bool bVar5;
  pointer puVar6;
  iterator ebi;
  code *local_140;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_118;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  reachable_blocks;
  anon_class_32_4_f94b8823 mark_reachable;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  visited_blocks;
  queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  worklist;
  
  reachable_blocks._M_h._M_buckets = &reachable_blocks._M_h._M_single_bucket;
  reachable_blocks._M_h._M_bucket_count = 1;
  reachable_blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  reachable_blocks._M_h._M_element_count = 0;
  reachable_blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  reachable_blocks._M_h._M_rehash_policy._M_next_resize = 0;
  reachable_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  visited_blocks._M_h._M_buckets = &visited_blocks._M_h._M_single_bucket;
  visited_blocks._M_h._M_bucket_count = 1;
  visited_blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited_blocks._M_h._M_element_count = 0;
  visited_blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  visited_blocks._M_h._M_rehash_policy._M_next_resize = 0;
  visited_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  queue<spvtools::opt::BasicBlock*,std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>
  ::queue<std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>,void>
            (&worklist);
  pvVar1 = &func->blocks_;
  mark_reachable.reachable_blocks =
       *(unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
         **)&(((func->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t;
  std::__detail::
  _Insert<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert((_Insert<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            *)&reachable_blocks._M_h,(value_type *)&mark_reachable);
  mark_reachable.reachable_blocks =
       *(unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
         **)&(((func->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t;
  std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
  emplace_back<spvtools::opt::BasicBlock*>
            ((deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
             &worklist,(BasicBlock **)&mark_reachable);
  mark_reachable.visited_blocks = &visited_blocks;
  mark_reachable.reachable_blocks =
       (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
        *)&reachable_blocks._M_h;
  mark_reachable.worklist = &worklist;
  mark_reachable.this = this;
  while (worklist.c.
         super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         worklist.c.
         super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pBVar2 = *worklist.c.
              super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::pop_front
              ((deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
               &worklist);
    std::function<void(unsigned_int)>::
    function<spvtools::opt::MemPass::RemoveUnreachableBlocks(spvtools::opt::Function*)::__0&,void>
              ((function<void(unsigned_int)> *)((_Any_data *)&ebi)->_M_pod_data,&mark_reachable);
    BasicBlock::ForEachSuccessorLabel(pBVar2,(function<void_(unsigned_int)> *)&ebi);
    if (local_140 != (code *)0x0) {
      (*local_140)((_Any_data *)&ebi,(_Any_data *)&ebi,__destroy_functor);
    }
    std::function<void(unsigned_int)>::
    function<spvtools::opt::MemPass::RemoveUnreachableBlocks(spvtools::opt::Function*)::__0&,void>
              ((function<void(unsigned_int)> *)((_Any_data *)&ebi)->_M_pod_data,&mark_reachable);
    BasicBlock::ForMergeAndContinueLabel(pBVar2,(function<void_(unsigned_int)> *)&ebi);
    if (local_140 != (code *)0x0) {
      (*local_140)((_Any_data *)&ebi,(_Any_data *)&ebi,__destroy_functor);
    }
  }
  puVar3 = (func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (func->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar3; puVar6 = puVar6 + 1) {
    pBVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    ebi.container_ = (UptrVector *)pBVar2;
    sVar4 = std::
            _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&reachable_blocks._M_h,(key_type *)&ebi);
    if (sVar4 != 0) {
      ebi.container_ = (UptrVector *)&reachable_blocks._M_h;
      ebi.iterator_._M_current =
           (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *
           )this;
      BasicBlock::ForEachPhiInst(pBVar2,(function<void_(spvtools::opt::Instruction_*)> *)&ebi,false)
      ;
      std::
      _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:463:26)>
      ::_M_manager((_Any_data *)&ebi,(_Any_data *)&ebi,__destroy_functor);
    }
  }
  ebi.iterator_._M_current =
       (pvVar1->
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = false;
  ebi.container_ = pvVar1;
  while ((ebi.container_ != pvVar1 ||
         (ebi.iterator_._M_current !=
          (func->blocks_).
          super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish))) {
    local_118._M_head_impl =
         ((ebi.iterator_._M_current)->_M_t).
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    sVar4 = std::
            _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&reachable_blocks._M_h,&local_118._M_head_impl);
    if (sVar4 == 0) {
      RemoveBlock(this,&ebi);
      bVar5 = true;
    }
    else {
      ebi.iterator_._M_current = ebi.iterator_._M_current + 1;
    }
  }
  std::_Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  ~_Deque_base((_Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                *)&worklist);
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&visited_blocks._M_h);
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&reachable_blocks._M_h);
  return bVar5;
}

Assistant:

bool MemPass::RemoveUnreachableBlocks(Function* func) {
  bool modified = false;

  // Mark reachable all blocks reachable from the function's entry block.
  std::unordered_set<BasicBlock*> reachable_blocks;
  std::unordered_set<BasicBlock*> visited_blocks;
  std::queue<BasicBlock*> worklist;
  reachable_blocks.insert(func->entry().get());

  // Initially mark the function entry point as reachable.
  worklist.push(func->entry().get());

  auto mark_reachable = [&reachable_blocks, &visited_blocks, &worklist,
                         this](uint32_t label_id) {
    auto successor = cfg()->block(label_id);
    if (visited_blocks.count(successor) == 0) {
      reachable_blocks.insert(successor);
      worklist.push(successor);
      visited_blocks.insert(successor);
    }
  };

  // Transitively mark all blocks reachable from the entry as reachable.
  while (!worklist.empty()) {
    BasicBlock* block = worklist.front();
    worklist.pop();

    // All the successors of a live block are also live.
    static_cast<const BasicBlock*>(block)->ForEachSuccessorLabel(
        mark_reachable);

    // All the Merge and ContinueTarget blocks of a live block are also live.
    block->ForMergeAndContinueLabel(mark_reachable);
  }

  // Update operands of Phi nodes that reference unreachable blocks.
  for (auto& block : *func) {
    // If the block is about to be removed, don't bother updating its
    // Phi instructions.
    if (reachable_blocks.count(&block) == 0) {
      continue;
    }

    // If the block is reachable and has Phi instructions, remove all
    // operands from its Phi instructions that reference unreachable blocks.
    // If the block has no Phi instructions, this is a no-op.
    block.ForEachPhiInst([&reachable_blocks, this](Instruction* phi) {
      RemovePhiOperands(phi, reachable_blocks);
    });
  }

  // Erase unreachable blocks.
  for (auto ebi = func->begin(); ebi != func->end();) {
    if (reachable_blocks.count(&*ebi) == 0) {
      RemoveBlock(&ebi);
      modified = true;
    } else {
      ++ebi;
    }
  }

  return modified;
}